

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuThreads.cpp
# Opt level: O0

bool __thiscall xmrig::CpuThreads::isEqual(CpuThreads *this,CpuThreads *other)

{
  bool bVar1;
  vector<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_> *this_00;
  vector<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_> *pvVar2;
  const_iterator __first1;
  const_iterator __last1;
  const_iterator __first2;
  bool local_39;
  bool local_1;
  
  bVar1 = isEmpty((CpuThreads *)0x2027bd);
  if ((bVar1) && (bVar1 = isEmpty((CpuThreads *)0x2027cd), bVar1)) {
    local_1 = true;
  }
  else {
    this_00 = (vector<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_> *)
              count((CpuThreads *)0x2027e7);
    pvVar2 = (vector<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_> *)
             count((CpuThreads *)0x2027f5);
    local_39 = false;
    if (this_00 == pvVar2) {
      __first1 = std::vector<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>::begin(this_00);
      __last1 = std::vector<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>::end(this_00);
      __first2 = std::vector<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>::begin(this_00);
      local_39 = std::
                 equal<__gnu_cxx::__normal_iterator<xmrig::CpuThread_const*,std::vector<xmrig::CpuThread,std::allocator<xmrig::CpuThread>>>,__gnu_cxx::__normal_iterator<xmrig::CpuThread_const*,std::vector<xmrig::CpuThread,std::allocator<xmrig::CpuThread>>>>
                           ((__normal_iterator<const_xmrig::CpuThread_*,_std::vector<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>_>
                             )__first1._M_current,
                            (__normal_iterator<const_xmrig::CpuThread_*,_std::vector<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>_>
                             )__last1._M_current,
                            (__normal_iterator<const_xmrig::CpuThread_*,_std::vector<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>_>
                             )__first2._M_current);
    }
    local_1 = local_39;
  }
  return local_1;
}

Assistant:

bool xmrig::CpuThreads::isEqual(const CpuThreads &other) const
{
    if (isEmpty() && other.isEmpty()) {
        return true;
    }

    return count() == other.count() && std::equal(m_data.begin(), m_data.end(), other.m_data.begin());
}